

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

void inverse_mdct(float *buffer,int n,vorb *f,int blocktype)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  undefined4 extraout_var;
  float *pfVar8;
  uint uVar9;
  float *pfVar10;
  ushort *puVar11;
  long lVar12;
  float *pfVar13;
  float *pfVar14;
  int iVar15;
  float *pfVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float afStack_c8 [2];
  ulong local_c0;
  vorb *local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  undefined8 local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  int local_84;
  int local_80;
  int local_7c;
  ulong local_78;
  int a_off;
  undefined1 local_68 [16];
  ulong local_58;
  ulong local_50;
  int local_44;
  float *local_40;
  int local_34;
  
  local_68._8_8_ = local_68._0_8_;
  pfVar16 = afStack_c8;
  uVar9 = n >> 1;
  local_50 = (ulong)uVar9;
  local_80 = f->temp_offset;
  local_40 = buffer;
  local_34 = n;
  if ((f->alloc).alloc_buffer == (char *)0x0) {
    pfVar16 = (float *)((long)afStack_c8 - ((long)(int)uVar9 * 4 + 0xfU & 0xfffffffffffffff0));
    _a_off = pfVar16;
  }
  else {
    _a_off = (float *)setup_temp_malloc(f,uVar9 * 4);
  }
  iVar15 = local_34;
  lVar21 = (long)(int)uVar9;
  iVar20 = local_34 >> 2;
  pfVar13 = f->A[(uint)blocktype];
  local_68._0_8_ = pfVar13;
  pfVar10 = pfVar13;
  pfVar8 = local_40;
  lVar19 = (long)(int)uVar9 * 4;
  for (lVar12 = lVar21 * 4; lVar7 = lVar19 + -8, lVar12 != 0; lVar12 = lVar12 + -0x10) {
    *(float *)((long)_a_off + lVar19 + -4) = *pfVar8 * *pfVar10 - pfVar10[1] * pfVar8[2];
    *(float *)((long)_a_off + lVar7) = *pfVar8 * pfVar10[1] + pfVar8[2] * *pfVar10;
    pfVar10 = pfVar10 + 2;
    pfVar8 = pfVar8 + 4;
    lVar19 = lVar7;
  }
  lVar12 = lVar21 * 4 + -4;
  for (lVar17 = 0; _a_off <= (float *)((long)_a_off + lVar17 + lVar7); lVar17 = lVar17 + -8) {
    *(float *)((long)_a_off + lVar19 + -4 + lVar17) =
         *(float *)((long)local_40 + lVar17 * 2 + lVar21 * 4 + -0xc) * pfVar10[1] -
         *(float *)((long)local_40 + lVar17 * 2 + lVar12) * *pfVar10;
    *(float *)((long)_a_off + lVar7 + lVar17) =
         -*(float *)((long)local_40 + lVar17 * 2 + lVar12) * pfVar10[1] -
         *pfVar10 * *(float *)((long)local_40 + lVar17 * 2 + lVar21 * 4 + -0xc);
    pfVar10 = pfVar10 + 2;
  }
  local_a8 = (long)iVar20;
  lVar12 = 0;
  pfVar10 = pfVar13 + lVar21;
  while (pfVar8 = pfVar10 + -8, pfVar13 <= pfVar8) {
    fVar27 = *(float *)((long)_a_off + lVar12 + local_a8 * 4 + 4);
    fVar24 = *(float *)((long)_a_off + lVar12 + 4);
    fVar26 = fVar27 - fVar24;
    fVar23 = *(float *)((long)_a_off + lVar12 + local_a8 * 4) - *(float *)((long)_a_off + lVar12);
    *(float *)((long)local_40 + lVar12 + local_a8 * 4 + 4) = fVar27 + fVar24;
    *(float *)((long)local_40 + lVar12 + local_a8 * 4) =
         *(float *)((long)_a_off + lVar12 + local_a8 * 4) + *(float *)((long)_a_off + lVar12);
    *(float *)((long)local_40 + lVar12 + 4) = pfVar10[-4] * fVar26 - pfVar10[-3] * fVar23;
    *(float *)((long)local_40 + lVar12) = fVar23 * pfVar10[-4] + fVar26 * pfVar10[-3];
    fVar27 = *(float *)((long)_a_off + lVar12 + local_a8 * 4 + 0xc);
    fVar24 = *(float *)((long)_a_off + lVar12 + 0xc);
    fVar23 = *(float *)((long)_a_off + lVar12 + local_a8 * 4 + 8) -
             *(float *)((long)_a_off + lVar12 + 8);
    *(float *)((long)local_40 + lVar12 + local_a8 * 4 + 0xc) = fVar27 + fVar24;
    fVar27 = fVar27 - fVar24;
    *(float *)((long)local_40 + lVar12 + local_a8 * 4 + 8) =
         *(float *)((long)_a_off + lVar12 + local_a8 * 4 + 8) +
         *(float *)((long)_a_off + lVar12 + 8);
    *(float *)((long)local_40 + lVar12 + 0xc) = *pfVar8 * fVar27 - pfVar10[-7] * fVar23;
    *(float *)((long)local_40 + lVar12 + 8) = fVar23 * *pfVar8 + fVar27 * pfVar10[-7];
    lVar12 = lVar12 + 0x10;
    pfVar10 = pfVar8;
  }
  local_b8 = f;
  local_b0 = (ulong)(uint)blocktype;
  local_a0 = lVar21;
  local_78 = (ulong)(uint)(local_34 >> 3);
  pfVar16[-2] = 2.243257e-39;
  pfVar16[-1] = 0.0;
  iVar6 = ilog(iVar15);
  pfVar13 = local_40;
  local_58 = CONCAT44(extraout_var,iVar6);
  iVar15 = iVar15 >> 4;
  iVar6 = (int)local_50 + -1;
  iVar22 = (int)local_78;
  uVar4 = local_68._0_8_;
  local_44 = iVar6;
  pfVar16[-2] = 2.243329e-39;
  pfVar16[-1] = 0.0;
  imdct_step3_iter0_loop(iVar15,pfVar13,iVar6,-iVar22,(float *)uVar4);
  iVar6 = (int)local_50;
  pfVar16[-2] = 2.24337e-39;
  pfVar16[-1] = 0.0;
  imdct_step3_iter0_loop(iVar15,pfVar13,(iVar6 - iVar20) + -1,-iVar22,(float *)uVar4);
  iVar22 = local_34 >> 5;
  iVar15 = -iVar15;
  pfVar16[-2] = 2.24208e-44;
  iVar20 = local_44;
  pfVar16[-1] = 0.0;
  uVar3 = *(undefined8 *)(pfVar16 + -2);
  pfVar16[-2] = 2.243421e-39;
  pfVar16[-1] = 0.0;
  imdct_step3_inner_r_loop(iVar22,pfVar13,iVar20,iVar15,(float *)uVar4,(int)uVar3);
  iVar6 = (int)local_78;
  pfVar16[-2] = 2.24208e-44;
  pfVar16[-1] = 0.0;
  uVar3 = *(undefined8 *)(pfVar16 + -2);
  pfVar16[-2] = 2.243463e-39;
  pfVar16[-1] = 0.0;
  imdct_step3_inner_r_loop(iVar22,pfVar13,iVar20 - iVar6,iVar15,(float *)uVar4,(int)uVar3);
  iVar20 = local_44 + iVar6 * -2;
  pfVar16[-2] = 2.24208e-44;
  pfVar16[-1] = 0.0;
  uVar3 = *(undefined8 *)(pfVar16 + -2);
  pfVar16[-2] = 2.243504e-39;
  pfVar16[-1] = 0.0;
  imdct_step3_inner_r_loop(iVar22,pfVar13,iVar20,iVar15,(float *)uVar4,(int)uVar3);
  iVar20 = (int)local_50;
  local_7c = iVar22;
  pfVar16[-2] = 2.24208e-44;
  pfVar16[-1] = 0.0;
  uVar3 = *(undefined8 *)(pfVar16 + -2);
  pfVar16[-2] = 2.243556e-39;
  pfVar16[-1] = 0.0;
  imdct_step3_inner_r_loop(iVar22,pfVar13,iVar6 * -3 + iVar20 + -1,iVar15,(float *)uVar4,(int)uVar3)
  ;
  local_84 = (int)local_58 + -4 >> 1;
  pfVar16[-2] = 2.8026e-45;
  pfVar16[-1] = 0.0;
  uVar18 = *(ulong *)(pfVar16 + -2) & 0xffffffff;
  while (iVar15 = local_34, (int)uVar18 < local_84) {
    bVar5 = (byte)uVar18;
    iVar22 = local_34 >> (bVar5 + 2 & 0x1f);
    pfVar16[-2] = 2.8026e-45;
    pfVar16[-1] = 0.0;
    uVar3 = *(undefined8 *)(pfVar16 + -2);
    local_98 = (float *)CONCAT44(local_98._4_4_,iVar22);
    pfVar16[-2] = 1.12104e-44;
    pfVar16[-1] = 0.0;
    uVar4 = *(undefined8 *)(pfVar16 + -2);
    local_c0 = uVar18;
    iVar6 = local_44;
    iVar20 = (int)uVar3 << (bVar5 & 0x1f);
    if ((int)uVar3 << (bVar5 & 0x1f) < 1) {
      iVar20 = 0;
    }
    while (pfVar13 = local_40, iVar20 != 0) {
      uVar3 = local_68._0_8_;
      pfVar16[-2] = 2.243744e-39;
      pfVar16[-1] = 0.0;
      imdct_step3_inner_r_loop
                (iVar15 >> (bVar5 + 4 & 0x1f),pfVar13,iVar6,-(iVar22 >> 1),(float *)uVar3,
                 (int)uVar4 << (bVar5 & 0x1f));
      iVar6 = iVar6 - (int)(float)local_98;
      iVar20 = iVar20 + -1;
    }
    uVar18 = (ulong)((int)local_c0 + 1);
  }
  local_58 = (ulong)((int)local_58 - 7);
  local_98 = local_40 + local_a0 + -2;
  while( true ) {
    iVar20 = local_34;
    iVar15 = local_80;
    if ((int)local_58 <= (int)uVar18) break;
    bVar5 = (byte)uVar18;
    iVar15 = local_34 >> (bVar5 + 2 & 0x1f);
    pfVar16[-2] = 1.12104e-44;
    pfVar16[-1] = 0.0;
    uVar3 = *(undefined8 *)(pfVar16 + -2);
    iVar20 = iVar20 >> (bVar5 + 6 & 0x1f);
    pfVar16[-2] = 2.8026e-45;
    pfVar16[-1] = 0.0;
    uVar4 = *(undefined8 *)(pfVar16 + -2);
    pfVar16[-2] = 2.24208e-44;
    pfVar16[-1] = 0.0;
    iVar6 = (int)*(undefined8 *)(pfVar16 + -2) << (bVar5 & 0x1f);
    lVar12 = (long)((int)uVar3 << (bVar5 & 0x1f));
    pfVar16[-2] = 3.36312e-44;
    pfVar16[-1] = 0.0;
    lVar21 = (long)((int)*(undefined8 *)(pfVar16 + -2) << (bVar5 & 0x1f));
    pfVar16[-2] = 4.48416e-44;
    pfVar16[-1] = 0.0;
    uVar3 = *(undefined8 *)(pfVar16 + -2);
    pfVar16[-2] = -NAN;
    pfVar16[-1] = -NAN;
    lVar19 = *(long *)(pfVar16 + -2) + (long)(iVar15 >> 1) * -4;
    pfVar10 = local_98;
    pfVar13 = (float *)local_68._0_8_;
    for (; 0 < iVar20; iVar20 = iVar20 + -1) {
      fVar27 = pfVar13[lVar21];
      fVar24 = pfVar13[lVar21 + 1];
      fVar23 = pfVar13[iVar6];
      fVar26 = pfVar13[iVar6 + 1];
      fVar25 = pfVar13[lVar12];
      fVar28 = pfVar13[lVar12 + 1];
      fVar29 = *pfVar13;
      fVar1 = pfVar13[1];
      pfVar8 = pfVar10;
      for (iVar22 = (int)uVar4 << (bVar5 & 0x1f); 0 < iVar22; iVar22 = iVar22 + -1) {
        uVar2 = *(undefined8 *)((long)pfVar8 + lVar19 + 8);
        fVar30 = (float)*(undefined8 *)pfVar8;
        fVar31 = (float)((ulong)*(undefined8 *)pfVar8 >> 0x20);
        fVar33 = fVar30 - (float)uVar2;
        fVar32 = (float)((ulong)uVar2 >> 0x20);
        fVar34 = fVar31 - fVar32;
        pfVar8[1] = fVar32 + fVar31;
        *pfVar8 = fVar30 + *(float *)((long)pfVar8 + lVar19 + 8);
        *(ulong *)((long)pfVar8 + lVar19 + 8) =
             CONCAT44(fVar34 * fVar29 + -fVar33 * fVar1,fVar33 * fVar29 + fVar34 * fVar1);
        fVar30 = (float)*(undefined8 *)(pfVar8 + -2);
        fVar31 = (float)((ulong)*(undefined8 *)(pfVar8 + -2) >> 0x20);
        fVar33 = fVar30 - (float)*(undefined8 *)((long)pfVar8 + lVar19);
        fVar32 = (float)((ulong)*(undefined8 *)((long)pfVar8 + lVar19) >> 0x20);
        fVar34 = fVar31 - fVar32;
        pfVar8[-1] = fVar32 + fVar31;
        pfVar8[-2] = fVar30 + *(float *)((long)pfVar8 + lVar19);
        *(ulong *)((long)pfVar8 + lVar19) =
             CONCAT44(fVar34 * fVar25 + -fVar33 * fVar28,fVar33 * fVar25 + fVar34 * fVar28);
        uVar2 = *(undefined8 *)((long)pfVar8 + lVar19 + -8);
        fVar30 = (float)*(undefined8 *)(pfVar8 + -4);
        fVar31 = (float)((ulong)*(undefined8 *)(pfVar8 + -4) >> 0x20);
        fVar33 = fVar30 - (float)uVar2;
        fVar32 = (float)((ulong)uVar2 >> 0x20);
        fVar34 = fVar31 - fVar32;
        pfVar8[-3] = fVar32 + fVar31;
        pfVar8[-4] = fVar30 + *(float *)((long)pfVar8 + lVar19 + -8);
        *(ulong *)((long)pfVar8 + lVar19 + -8) =
             CONCAT44(fVar34 * fVar23 + -fVar33 * fVar26,fVar33 * fVar23 + fVar34 * fVar26);
        uVar2 = *(undefined8 *)((long)pfVar8 + lVar19 + -0x10);
        fVar30 = (float)*(undefined8 *)(pfVar8 + -6);
        fVar31 = (float)((ulong)*(undefined8 *)(pfVar8 + -6) >> 0x20);
        fVar33 = fVar30 - (float)uVar2;
        fVar32 = (float)((ulong)uVar2 >> 0x20);
        fVar34 = fVar31 - fVar32;
        pfVar8[-5] = fVar32 + fVar31;
        pfVar8[-6] = fVar30 + *(float *)((long)pfVar8 + lVar19 + -0x10);
        *(ulong *)((long)pfVar8 + lVar19 + -0x10) =
             CONCAT44(fVar34 * fVar27 + -fVar33 * fVar24,fVar33 * fVar27 + fVar34 * fVar24);
        pfVar8 = pfVar8 + -(long)iVar15;
      }
      pfVar13 = pfVar13 + ((int)uVar3 << (bVar5 & 0x1f));
      pfVar10 = pfVar10 + -8;
    }
    uVar18 = (ulong)((int)uVar18 + 1);
  }
  uVar9 = *(uint *)(local_68._0_8_ + (long)(int)local_78 * 4);
  pfVar13 = local_40 + local_44;
  pfVar10 = pfVar13 + local_7c * -0x10;
  local_68 = ZEXT416(uVar9);
  local_98 = (float *)CONCAT44(0x80000000,uVar9 ^ 0x80000000);
  uStack_90 = 0x80000000;
  uStack_8c = 0x80000000;
  for (; pfVar10 < pfVar13; pfVar13 = pfVar13 + -0x10) {
    fVar27 = pfVar13[-0xc];
    fVar24 = pfVar13[-5];
    fVar23 = pfVar13[-4];
    fVar26 = pfVar13[-1];
    fVar25 = *pfVar13;
    fVar28 = pfVar13[-3] - pfVar13[-0xb];
    fVar29 = pfVar13[-2] - pfVar13[-10];
    pfVar13[-3] = pfVar13[-3] + pfVar13[-0xb];
    pfVar13[-2] = pfVar13[-2] + pfVar13[-10];
    pfVar13[-1] = fVar26 + pfVar13[-9];
    *pfVar13 = fVar25 + pfVar13[-8];
    pfVar13[-0xb] = (float)local_68._0_4_ * (fVar28 - fVar29);
    pfVar13[-10] = (float)local_68._0_4_ * (fVar29 + fVar28);
    pfVar13[-9] = fVar26 - pfVar13[-9];
    pfVar13[-8] = fVar25 - pfVar13[-8];
    fVar26 = pfVar13[-7] - pfVar13[-0xf];
    fVar25 = pfVar13[-6] - pfVar13[-0xe];
    pfVar13[-7] = pfVar13[-7] + pfVar13[-0xf];
    pfVar13[-6] = pfVar13[-6] + pfVar13[-0xe];
    pfVar13[-5] = fVar24 + pfVar13[-0xd];
    pfVar13[-4] = fVar23 + fVar27;
    pfVar13[-0xc] = fVar24 - pfVar13[-0xd];
    pfVar13[-0xd] = -(fVar23 - fVar27);
    pfVar13[-0xe] = (fVar26 - fVar25) * (float)local_68._0_4_;
    pfVar13[-0xf] = (fVar25 + fVar26) * (float)local_98;
    pfVar16[-2] = 2.244988e-39;
    pfVar16[-1] = 0.0;
    iter_54(pfVar13);
    pfVar16[-2] = 2.245e-39;
    pfVar16[-1] = 0.0;
    iter_54(pfVar13 + -8);
  }
  puVar11 = local_b8->bit_reverse[local_b0];
  pfVar10 = _a_off + (long)(int)local_50 + -1;
  for (pfVar13 = _a_off + local_a8 + -4; _a_off <= pfVar13; pfVar13 = pfVar13 + -4) {
    uVar18 = (ulong)*puVar11;
    *pfVar10 = local_40[uVar18];
    pfVar10[-1] = local_40[uVar18 + 1];
    pfVar13[3] = local_40[uVar18 + 2];
    pfVar13[2] = local_40[uVar18 + 3];
    uVar18 = (ulong)puVar11[1];
    pfVar10[-2] = local_40[uVar18];
    pfVar10[-3] = local_40[uVar18 + 1];
    pfVar13[1] = local_40[uVar18 + 2];
    *pfVar13 = local_40[uVar18 + 3];
    puVar11 = puVar11 + 2;
    pfVar10 = pfVar10 + -4;
  }
  pfVar8 = local_b8->C[local_b0] + 3;
  pfVar13 = _a_off + local_a0;
  for (pfVar10 = _a_off; pfVar14 = pfVar13 + -4, pfVar10 < pfVar14; pfVar10 = pfVar10 + 4) {
    fVar23 = (float)*(undefined8 *)pfVar10;
    fVar24 = (float)((ulong)*(undefined8 *)pfVar10 >> 0x20);
    fVar27 = (float)*(undefined8 *)(pfVar13 + -2);
    fVar26 = fVar23 - fVar27;
    fVar28 = (float)((ulong)*(undefined8 *)(pfVar13 + -2) >> 0x20);
    fVar25 = fVar24 - fVar28;
    fVar23 = fVar23 + fVar27;
    fVar24 = fVar24 + fVar28;
    fVar27 = pfVar8[-2] * fVar26 + pfVar8[-3] * fVar24;
    fVar24 = pfVar8[-2] * fVar24 + -pfVar8[-3] * fVar26;
    *(ulong *)pfVar10 = CONCAT44(fVar25 + fVar24,fVar23 + fVar27);
    *(ulong *)(pfVar13 + -2) = CONCAT44(fVar24 - fVar25,fVar23 - fVar27);
    fVar23 = (float)*(undefined8 *)(pfVar10 + 2);
    fVar24 = (float)((ulong)*(undefined8 *)(pfVar10 + 2) >> 0x20);
    fVar27 = (float)*(undefined8 *)pfVar14;
    fVar26 = fVar23 - fVar27;
    fVar28 = (float)((ulong)*(undefined8 *)pfVar14 >> 0x20);
    fVar25 = fVar24 - fVar28;
    fVar23 = fVar23 + fVar27;
    fVar24 = fVar24 + fVar28;
    fVar27 = *pfVar8 * fVar26 + pfVar8[-1] * fVar24;
    fVar24 = *pfVar8 * fVar24 + -pfVar8[-1] * fVar26;
    *(ulong *)(pfVar10 + 2) = CONCAT44(fVar25 + fVar24,fVar23 + fVar27);
    *(ulong *)pfVar14 = CONCAT44(fVar24 - fVar25,fVar23 - fVar27);
    pfVar8 = pfVar8 + 4;
    pfVar13 = pfVar14;
  }
  lVar12 = (long)(int)local_50 * 4 + -4;
  lVar19 = local_a0 * 4 + 0xc;
  lVar21 = (long)local_34 * 4 + -4;
  pfVar13 = local_b8->B[local_b0] + local_a0 + -1;
  pfVar16[-2] = 1.68156e-44;
  pfVar16[-1] = 0.0;
  lVar7 = *(long *)(pfVar16 + -2);
  pfVar16 = _a_off + local_a0;
  while (pfVar10 = pfVar16 + -8, _a_off <= pfVar10) {
    fVar24 = pfVar16[-2] * *pfVar13 - pfVar13[-1] * pfVar16[-1];
    fVar27 = -pfVar16[-2] * pfVar13[-1] - *pfVar13 * pfVar16[-1];
    *(float *)((long)local_40 + lVar7 + -0xc) = fVar24;
    *(float *)((long)local_40 + lVar12) = -fVar24;
    *(float *)((long)local_40 + lVar19 + -0xc) = fVar27;
    *(float *)((long)local_40 + lVar21) = fVar27;
    fVar24 = pfVar16[-4] * pfVar13[-2] - pfVar13[-3] * pfVar16[-3];
    fVar27 = -pfVar16[-4] * pfVar13[-3] - pfVar13[-2] * pfVar16[-3];
    *(float *)((long)local_40 + lVar7 + -8) = fVar24;
    *(float *)((long)local_40 + lVar12 + -4) = -fVar24;
    *(float *)((long)local_40 + lVar19 + -8) = fVar27;
    *(float *)((long)local_40 + lVar21 + -4) = fVar27;
    fVar24 = pfVar16[-6] * pfVar13[-4] - pfVar13[-5] * pfVar16[-5];
    fVar27 = -pfVar16[-6] * pfVar13[-5] - pfVar13[-4] * pfVar16[-5];
    *(float *)((long)local_40 + lVar7 + -4) = fVar24;
    *(float *)((long)local_40 + lVar12 + -8) = -fVar24;
    *(float *)((long)local_40 + lVar19 + -4) = fVar27;
    *(float *)((long)local_40 + lVar21 + -8) = fVar27;
    fVar24 = *pfVar10 * pfVar13[-6] - pfVar13[-7] * pfVar16[-7];
    fVar27 = -*pfVar10 * pfVar13[-7] - pfVar13[-6] * pfVar16[-7];
    *(float *)((long)local_40 + lVar7) = fVar24;
    *(float *)((long)local_40 + lVar12 + -0xc) = -fVar24;
    *(float *)((long)local_40 + lVar19) = fVar27;
    *(float *)((long)local_40 + lVar21 + -0xc) = fVar27;
    lVar7 = lVar7 + 0x10;
    lVar12 = lVar12 + -0x10;
    lVar19 = lVar19 + 0x10;
    lVar21 = lVar21 + -0x10;
    pfVar13 = pfVar13 + -8;
    pfVar16 = pfVar10;
  }
  local_b8->temp_offset = iVar15;
  return;
}

Assistant:

static void inverse_mdct(float *buffer, int n, vorb *f, int blocktype)
{
   int n2 = n >> 1, n4 = n >> 2, n8 = n >> 3, l;
   int ld;
   // @OPTIMIZE: reduce register pressure by using fewer variables?
   int save_point = temp_alloc_save(f);
   float *buf2 = (float *) temp_alloc(f, n2 * sizeof(*buf2));
   float *u=NULL,*v=NULL;
   // twiddle factors
   float *A = f->A[blocktype];

   // IMDCT algorithm from "The use of multirate filter banks for coding of high quality digital audio"
   // See notes about bugs in that paper in less-optimal implementation 'inverse_mdct_old' after this function.

   // kernel from paper


   // merged:
   //   copy and reflect spectral data
   //   step 0

   // note that it turns out that the items added together during
   // this step are, in fact, being added to themselves (as reflected
   // by step 0). inexplicable inefficiency! this became obvious
   // once I combined the passes.

   // so there's a missing 'times 2' here (for adding X to itself).
   // this propagates through linearly to the end, where the numbers
   // are 1/2 too small, and need to be compensated for.

   {
      float *d,*e, *AA, *e_stop;
      d = &buf2[n2-2];
      AA = A;
      e = &buffer[0];
      e_stop = &buffer[n2];
      while (e != e_stop) {
         d[1] = (e[0] * AA[0] - e[2]*AA[1]);
         d[0] = (e[0] * AA[1] + e[2]*AA[0]);
         d -= 2;
         AA += 2;
         e += 4;
      }

      e = &buffer[n2-3];
      while (d >= buf2) {
         d[1] = (-e[2] * AA[0] - -e[0]*AA[1]);
         d[0] = (-e[2] * AA[1] + -e[0]*AA[0]);
         d -= 2;
         AA += 2;
         e -= 4;
      }
   }

   // now we use symbolic names for these, so that we can
   // possibly swap their meaning as we change which operations
   // are in place

   u = buffer;
   v = buf2;

   // step 2    (paper output is w, now u)
   // this could be in place, but the data ends up in the wrong
   // place... _somebody_'s got to swap it, so this is nominated
   {
      float *AA = &A[n2-8];
      float *d0,*d1, *e0, *e1;

      e0 = &v[n4];
      e1 = &v[0];

      d0 = &u[n4];
      d1 = &u[0];

      while (AA >= A) {
         float v40_20, v41_21;

         v41_21 = e0[1] - e1[1];
         v40_20 = e0[0] - e1[0];
         d0[1]  = e0[1] + e1[1];
         d0[0]  = e0[0] + e1[0];
         d1[1]  = v41_21*AA[4] - v40_20*AA[5];
         d1[0]  = v40_20*AA[4] + v41_21*AA[5];

         v41_21 = e0[3] - e1[3];
         v40_20 = e0[2] - e1[2];
         d0[3]  = e0[3] + e1[3];
         d0[2]  = e0[2] + e1[2];
         d1[3]  = v41_21*AA[0] - v40_20*AA[1];
         d1[2]  = v40_20*AA[0] + v41_21*AA[1];

         AA -= 8;

         d0 += 4;
         d1 += 4;
         e0 += 4;
         e1 += 4;
      }
   }

   // step 3
   ld = ilog(n) - 1; // ilog is off-by-one from normal definitions

   // optimized step 3:

   // the original step3 loop can be nested r inside s or s inside r;
   // it's written originally as s inside r, but this is dumb when r
   // iterates many times, and s few. So I have two copies of it and
   // switch between them halfway.

   // this is iteration 0 of step 3
   imdct_step3_iter0_loop(n >> 4, u, n2-1-n4*0, -(n >> 3), A);
   imdct_step3_iter0_loop(n >> 4, u, n2-1-n4*1, -(n >> 3), A);

   // this is iteration 1 of step 3
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*0, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*1, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*2, -(n >> 4), A, 16);
   imdct_step3_inner_r_loop(n >> 5, u, n2-1 - n8*3, -(n >> 4), A, 16);

   l=2;
   for (; l < (ld-3)>>1; ++l) {
      int k0 = n >> (l+2), k0_2 = k0>>1;
      int lim = 1 << (l+1);
      int i;
      for (i=0; i < lim; ++i)
         imdct_step3_inner_r_loop(n >> (l+4), u, n2-1 - k0*i, -k0_2, A, 1 << (l+3));
   }

   for (; l < ld-6; ++l) {
      int k0 = n >> (l+2), k1 = 1 << (l+3), k0_2 = k0>>1;
      int rlim = n >> (l+6), r;
      int lim = 1 << (l+1);
      int i_off;
      float *A0 = A;
      i_off = n2-1;
      for (r=rlim; r > 0; --r) {
         imdct_step3_inner_s_loop(lim, u, i_off, -k0_2, A0, k1, k0);
         A0 += k1*4;
         i_off -= 8;
      }
   }

   // iterations with count:
   //   ld-6,-5,-4 all interleaved together
   //       the big win comes from getting rid of needless flops
   //         due to the constants on pass 5 & 4 being all 1 and 0;
   //       combining them to be simultaneous to improve cache made little difference
   imdct_step3_inner_s_loop_ld654(n >> 5, u, n2-1, A, n);

   // output is u

   // step 4, 5, and 6
   // cannot be in-place because of step 5
   {
      uint16 *bitrev = f->bit_reverse[blocktype];
      // weirdly, I'd have thought reading sequentially and writing
      // erratically would have been better than vice-versa, but in
      // fact that's not what my testing showed. (That is, with
      // j = bitreverse(i), do you read i and write j, or read j and write i.)

      float *d0 = &v[n4-4];
      float *d1 = &v[n2-4];
      while (d0 >= v) {
         int k4;

         k4 = bitrev[0];
         d1[3] = u[k4+0];
         d1[2] = u[k4+1];
         d0[3] = u[k4+2];
         d0[2] = u[k4+3];

         k4 = bitrev[1];
         d1[1] = u[k4+0];
         d1[0] = u[k4+1];
         d0[1] = u[k4+2];
         d0[0] = u[k4+3];

         d0 -= 4;
         d1 -= 4;
         bitrev += 2;
      }
   }
   // (paper output is u, now v)


   // data must be in buf2
   assert(v == buf2);

   // step 7   (paper output is v, now v)
   // this is now in place
   {
      float *C = f->C[blocktype];
      float *d, *e;

      d = v;
      e = v + n2 - 4;

      while (d < e) {
         float a02,a11,b0,b1,b2,b3;

         a02 = d[0] - e[2];
         a11 = d[1] + e[3];

         b0 = C[1]*a02 + C[0]*a11;
         b1 = C[1]*a11 - C[0]*a02;

         b2 = d[0] + e[ 2];
         b3 = d[1] - e[ 3];

         d[0] = b2 + b0;
         d[1] = b3 + b1;
         e[2] = b2 - b0;
         e[3] = b1 - b3;

         a02 = d[2] - e[0];
         a11 = d[3] + e[1];

         b0 = C[3]*a02 + C[2]*a11;
         b1 = C[3]*a11 - C[2]*a02;

         b2 = d[2] + e[ 0];
         b3 = d[3] - e[ 1];

         d[2] = b2 + b0;
         d[3] = b3 + b1;
         e[0] = b2 - b0;
         e[1] = b1 - b3;

         C += 4;
         d += 4;
         e -= 4;
      }
   }

   // data must be in buf2


   // step 8+decode   (paper output is X, now buffer)
   // this generates pairs of data a la 8 and pushes them directly through
   // the decode kernel (pushing rather than pulling) to avoid having
   // to make another pass later

   // this cannot POSSIBLY be in place, so we refer to the buffers directly

   {
      float *d0,*d1,*d2,*d3;

      float *B = f->B[blocktype] + n2 - 8;
      float *e = buf2 + n2 - 8;
      d0 = &buffer[0];
      d1 = &buffer[n2-4];
      d2 = &buffer[n2];
      d3 = &buffer[n-4];
      while (e >= v) {
         float p0,p1,p2,p3;

         p3 =  e[6]*B[7] - e[7]*B[6];
         p2 = -e[6]*B[6] - e[7]*B[7];

         d0[0] =   p3;
         d1[3] = - p3;
         d2[0] =   p2;
         d3[3] =   p2;

         p1 =  e[4]*B[5] - e[5]*B[4];
         p0 = -e[4]*B[4] - e[5]*B[5];

         d0[1] =   p1;
         d1[2] = - p1;
         d2[1] =   p0;
         d3[2] =   p0;

         p3 =  e[2]*B[3] - e[3]*B[2];
         p2 = -e[2]*B[2] - e[3]*B[3];

         d0[2] =   p3;
         d1[1] = - p3;
         d2[2] =   p2;
         d3[1] =   p2;

         p1 =  e[0]*B[1] - e[1]*B[0];
         p0 = -e[0]*B[0] - e[1]*B[1];

         d0[3] =   p1;
         d1[0] = - p1;
         d2[3] =   p0;
         d3[0] =   p0;

         B -= 8;
         e -= 8;
         d0 += 4;
         d2 += 4;
         d1 -= 4;
         d3 -= 4;
      }
   }

   temp_free(f,buf2);
   temp_alloc_restore(f,save_point);
}